

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O3

floatx80 floatx80_default_nan_mips(float_status *status)

{
  undefined8 in_RDX;
  floatx80 fVar1;
  
  if (status->snan_bit_is_one == '\0') {
    fVar1._10_6_ = (undefined6)((ulong)in_RDX >> 0x10);
    fVar1.high = 0xffff;
    fVar1.low = 0xc000000000000000;
    return fVar1;
  }
  __assert_fail("!snan_bit_is_one(status)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat-specialize.inc.c"
                ,0xc5,"floatx80 floatx80_default_nan_mips(float_status *)");
}

Assistant:

floatx80 floatx80_default_nan(float_status *status)
{
    floatx80 r;

    /* None of the targets that have snan_bit_is_one use floatx80.  */
    assert(!snan_bit_is_one(status));
#if defined(TARGET_M68K)
    r.low = UINT64_C(0xFFFFFFFFFFFFFFFF);
    r.high = 0x7FFF;
#else
    /* X86 */
    r.low = UINT64_C(0xC000000000000000);
    r.high = 0xFFFF;
#endif
    return r;
}